

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

BFunc<6UL> * __thiscall GF2::BFunc<6UL>::Rand(BFunc<6UL> *this)

{
  Func<6UL,_bool> *in_RDI;
  word x;
  WW<64UL> w;
  size_t in_stack_ffffffffffffffb8;
  WW<64UL> *in_stack_ffffffffffffffc0;
  WW<64UL> *x_00;
  bool local_19;
  WW<64UL> *local_18;
  
  WW<64UL>::WW((WW<64UL> *)0x18820d);
  WW<64UL>::Rand(in_stack_ffffffffffffffc0);
  for (local_18 = (WW<64UL> *)0x0; local_18 < (WW<64UL> *)0x40;
      local_18 = (WW<64UL> *)((long)local_18->_words + 1)) {
    x_00 = local_18;
    WW<64UL>::operator[](local_18,in_stack_ffffffffffffffb8);
    local_19 = GF2::WW::Reference::operator_cast_to_bool((Reference *)0x188255);
    Func<6UL,_bool>::Set(in_RDI,(word)x_00,&local_19);
  }
  return (BFunc<6UL> *)in_RDI;
}

Assistant:

BFunc& Rand()
	{
		WW<_size> w;
		w.Rand();
		for (word x = 0; x < _size; x++)
			Set(x, w[x]);
		return *this;
	}